

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verifyLTP.hpp
# Opt level: O3

void njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering::LegendreCoefficients::
     verifyLTP(int LTP)

{
  undefined8 *puVar1;
  
  if (LTP == 2) {
    return;
  }
  tools::Log::error<char_const*>("Encountered illegal LTP value");
  tools::Log::info<char_const*>("LTP must be equal to 2 for legendre coefficients");
  tools::Log::info<char_const*,int>("LTP value: {}",LTP);
  puVar1 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar1 = getenv;
  __cxa_throw(puVar1,&std::exception::typeinfo,std::exception::~exception);
}

Assistant:

static void
verifyLTP( int LTP ) {

  if ( LTP != 2 ) {

    Log::error( "Encountered illegal LTP value" );
    Log::info( "LTP must be equal to 2 for legendre coefficients" );
    Log::info( "LTP value: {}", LTP );
    throw std::exception();
  }
}